

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::TiledInputFile::TiledInputFile(TiledInputFile *this,InputPartData *part)

{
  Data *this_00;
  size_t i;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_004216b0;
  this_00 = (Data *)operator_new(0x180);
  Data::Data(this_00,part->numThreads);
  this->_data = this_00;
  this_00->_deleteStream = false;
  multiPartInitialize(this,part);
  return;
}

Assistant:

TiledInputFile::TiledInputFile (InputPartData* part) 
{
    _data = new Data (part->numThreads);
    _data->_deleteStream=false;
    try
    {
      multiPartInitialize(part);
    }
    catch(...)
    {
        if(_data)
        {
          if (!_data->memoryMapped)
          {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if(_data->tileBuffers[i])
                {
                   delete [] _data->tileBuffers[i]->buffer;
                }
            }
          }
          delete _data;
        }
        throw;
    }
}